

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defopcode.c
# Opt level: O1

int compute_dashmask(char *pattern)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  
  sVar1 = strlen(pattern);
  if ((int)(uint)sVar1 < 1) {
    uVar4 = 0;
  }
  else {
    uVar2 = (ulong)((uint)sVar1 & 0x7fffffff);
    pcVar5 = pattern + uVar2;
    uVar3 = 0;
    uVar4 = 0;
    do {
      pcVar5 = pcVar5 + -1;
      uVar6 = 1 << ((byte)uVar3 & 0x1f);
      if (*pcVar5 != '-') {
        uVar6 = 0;
      }
      uVar4 = uVar4 | uVar6;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return uVar4;
}

Assistant:

static int
compute_dashmask (const char *pattern)
{
  int i, mask = 0, len = strlen (pattern);

  for (i = 0; i < len; i++)
    if (pattern[len - 1 - i] == '-')
      mask |= (1 << i);
  return mask;
}